

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

istreambuf_iterator<char,_std::char_traits<char>_>
picojson::
_parse<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
          (default_parse_context *ctx,istreambuf_iterator<char,_std::char_traits<char>_> *first,
          istreambuf_iterator<char,_std::char_traits<char>_> *last,string *err)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  istreambuf_iterator<char,_std::char_traits<char>_> iVar4;
  istreambuf_iterator<char,_std::char_traits<char>_> iVar5;
  undefined1 local_a8 [4];
  int ch;
  char buf [64];
  input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> in;
  string *err_local;
  istreambuf_iterator<char,_std::char_traits<char>_> *last_local;
  istreambuf_iterator<char,_std::char_traits<char>_> *first_local;
  default_parse_context *ctx_local;
  
  input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::input
            ((input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)(buf + 0x38),first,
             last);
  bVar1 = _parse<picojson::default_parse_context,std::istreambuf_iterator<char,std::char_traits<char>>>
                    (ctx,(input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                         (buf + 0x38));
  if ((!bVar1) && (err != (string *)0x0)) {
    uVar2 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::line
                      ((input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                       (buf + 0x38));
    snprintf(local_a8,0x40,"syntax error at line %d near: ",(ulong)uVar2);
    __stream = (FILE *)local_a8;
    std::__cxx11::string::operator=((string *)err,(char *)__stream);
    while ((iVar3 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::getc
                              ((input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)
                               (buf + 0x38),__stream), iVar3 != -1 && (iVar3 != 10))) {
      if (0x1f < iVar3) {
        __stream = (FILE *)(ulong)(uint)(int)(char)iVar3;
        std::__cxx11::string::push_back((char)err);
      }
    }
  }
  iVar4 = input<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::cur
                    ((input<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *)(buf + 0x38)
                    );
  iVar5._12_4_ = 0;
  iVar5._M_sbuf = (streambuf_type *)SUB128(iVar4._0_12_,0);
  iVar5._M_c = SUB124(iVar4._0_12_,8);
  return iVar5;
}

Assistant:

inline Iter _parse(Context& ctx, const Iter& first, const Iter& last, std::string* err) {
    input<Iter> in(first, last);
    if (! _parse(ctx, in) && err != NULL) {
      char buf[64];
      SNPRINTF(buf, sizeof(buf), "syntax error at line %d near: ", in.line());
      *err = buf;
      while (1) {
    int ch = in.getc();
    if (ch == -1 || ch == '\n') {
      break;
    } else if (ch >= ' ') {
      err->push_back(ch);
    }
      }
    }
    return in.cur();
  }